

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::detail::toStream(ostream *s,bool in)

{
  ostream *poVar1;
  
  *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) | 1;
  poVar1 = std::ostream::_M_insert<bool>(SUB81(s,0));
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xfffffffe;
  return;
}

Assistant:

void toStream(std::ostream* s, bool in) { *s << std::boolalpha << in << std::noboolalpha; }